

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cc
# Opt level: O0

int EditDistance(StringPiece *s1,StringPiece *s2,bool allow_replacements,int max_edit_distance)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  int *piVar4;
  int local_7c;
  int local_78;
  value_type local_74;
  int local_70;
  int old_row;
  int x;
  int previous;
  int best_this_row;
  int y;
  int i;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> row;
  int n;
  int m;
  int max_edit_distance_local;
  bool allow_replacements_local;
  StringPiece *s2_local;
  StringPiece *s1_local;
  
  row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (int)s1->len_;
  row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (int)s2->len_;
  iVar1 = (int)row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 1;
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar1,&local_49);
  std::allocator<int>::~allocator(&local_49);
  for (best_this_row = 1; iVar1 = best_this_row,
      best_this_row <=
      (int)row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage; best_this_row = best_this_row + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)best_this_row);
    *pvVar2 = iVar1;
  }
  previous = 1;
  do {
    iVar1 = previous;
    if (row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < previous) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,
                          (long)(int)row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
      s1_local._4_4_ = *pvVar2;
LAB_001e1f93:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48)
      ;
      return s1_local._4_4_;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,0);
    *pvVar2 = iVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,0);
    x = *pvVar2;
    old_row = previous + -1;
    for (local_70 = 1;
        local_70 <=
        (int)row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage; local_70 = local_70 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)local_70);
      iVar1 = old_row;
      local_74 = *pvVar2;
      if (allow_replacements) {
        local_78 = old_row + (uint)(s1->str_[previous + -1] != s2->str_[local_70 + -1]);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)(local_70 + -1));
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_70);
        piVar4 = std::min<int>(pvVar2,pvVar3);
        local_7c = *piVar4 + 1;
        piVar4 = std::min<int>(&local_78,&local_7c);
        iVar1 = *piVar4;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_70);
        *pvVar2 = iVar1;
      }
      else if (s1->str_[previous + -1] == s2->str_[local_70 + -1]) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_70);
        *pvVar2 = iVar1;
      }
      else {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)(local_70 + -1));
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_70);
        piVar4 = std::min<int>(pvVar2,pvVar3);
        iVar1 = *piVar4;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_70);
        *pvVar2 = iVar1 + 1;
      }
      old_row = local_74;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)local_70);
      piVar4 = std::min<int>(&x,pvVar2);
      x = *piVar4;
    }
    if ((max_edit_distance != 0) && (max_edit_distance < x)) {
      s1_local._4_4_ = max_edit_distance + 1;
      goto LAB_001e1f93;
    }
    previous = previous + 1;
  } while( true );
}

Assistant:

int EditDistance(const StringPiece& s1,
                 const StringPiece& s2,
                 bool allow_replacements,
                 int max_edit_distance) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in row[x-1], the top entry is what's in row[x] from the last
  // iteration, and the top-left entry is stored in previous.
  int m = s1.len_;
  int n = s2.len_;

  vector<int> row(n + 1);
  for (int i = 1; i <= n; ++i)
    row[i] = i;

  for (int y = 1; y <= m; ++y) {
    row[0] = y;
    int best_this_row = row[0];

    int previous = y - 1;
    for (int x = 1; x <= n; ++x) {
      int old_row = row[x];
      if (allow_replacements) {
        row[x] = min(previous + (s1.str_[y - 1] == s2.str_[x - 1] ? 0 : 1),
                     min(row[x - 1], row[x]) + 1);
      }
      else {
        if (s1.str_[y - 1] == s2.str_[x - 1])
          row[x] = previous;
        else
          row[x] = min(row[x - 1], row[x]) + 1;
      }
      previous = old_row;
      best_this_row = min(best_this_row, row[x]);
    }

    if (max_edit_distance && best_this_row > max_edit_distance)
      return max_edit_distance + 1;
  }

  return row[n];
}